

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O1

void __thiscall
CRegexParser::build_assert
          (CRegexParser *this,re_machine *new_machine,re_machine *sub_machine,int is_negative,
          int is_lookback)

{
  re_tuple_conflict *prVar1;
  re_tuple_conflict *prVar2;
  re_state_id rVar3;
  long lVar4;
  
  rVar3 = alloc_state(this);
  new_machine->init = rVar3;
  rVar3 = alloc_state(this);
  new_machine->final = rVar3;
  prVar2 = this->tuple_arr_;
  lVar4 = (long)new_machine->init;
  if (lVar4 != -1) {
    prVar1 = prVar2 + lVar4;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = ((uint)(is_lookback != 0) * 2 + 0x20) - (uint)(is_negative == 0);
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar3;
    }
    else {
      prVar1->next_state_2 = rVar3;
    }
  }
  prVar2[lVar4].info.ch = sub_machine->init;
  prVar2[lVar4].info.sub.final = sub_machine->final;
  if (is_lookback != 0) {
    get_match_length(this,sub_machine->init,sub_machine->final,&prVar2[lVar4].info.sub.minlen,
                     &prVar2[lVar4].info.sub.maxlen,(regex_scan_frame *)0x0);
    return;
  }
  return;
}

Assistant:

void CRegexParser::build_assert(re_machine *new_machine,
                                re_machine *sub_machine,
                                int is_negative, int is_lookback)
{
    /* initialize the container machine */
    init_machine(new_machine);

    /* get a pointer to its initial state */
    re_tuple *t = &tuple_arr_[new_machine->init];

    /* allocate a transition tuple for the new state */
    set_trans(new_machine->init, new_machine->final,
              (is_lookback
               ? (is_negative ? RE_ASSERT_BACKNEG : RE_ASSERT_BACKPOS)
               : (is_negative ? RE_ASSERT_NEG : RE_ASSERT_POS)),
              0);

    /* set the sub-state */
    t->info.sub.init = sub_machine->init;
    t->info.sub.final = sub_machine->final;

    /* 
     *   For lookback assertions, we need to know the range of possible match
     *   lengths, to optimize the reverse search for a match.  The
     *   sub-machine for the assertion is fully built now and is by nature
     *   self-contained, so we can calculate its length range now.  
     */
    if (is_lookback)
        get_match_length(sub_machine->init, sub_machine->final,
                         &t->info.sub.minlen, &t->info.sub.maxlen, 0);
}